

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall
amrex::StateDataPhysBCFunct::operator()
          (StateDataPhysBCFunct *this,MultiFab *mf,int dest_comp,int num_comp,IntVect *param_4,
          Real time,int param_6)

{
  Real *dx;
  Box *bx_00;
  int *piVar1;
  int iVar2;
  StateData *pSVar3;
  Geometry *pGVar4;
  BaseFab<double> *src;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  IndexType IVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  RealBox *prob_domain;
  int dir_2;
  uint uVar18;
  int iVar19;
  int iVar20;
  int aiStackY_2ac [55];
  undefined8 uStackY_1d0;
  Box hi_slab;
  Box lo_slab;
  Box bx;
  Box db;
  Box GrownDomain;
  MFIter mfi;
  FArrayBox tmp;
  
  pSVar3 = this->statedata;
  uStackY_1d0 = 0x488771;
  IVar13 = BATransformer::index_type
                     (&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat);
  bx.btype.itype = (pSVar3->domain).btype.itype;
  bx.smallend.vect[0] = (pSVar3->domain).smallend.vect[0];
  bx.smallend.vect[1] = (pSVar3->domain).smallend.vect[1];
  bx.smallend.vect[2] = (pSVar3->domain).smallend.vect[2];
  bx.bigend.vect[0] = (pSVar3->domain).bigend.vect[0];
  bx.bigend.vect[1] = (pSVar3->domain).bigend.vect[1];
  bx.bigend.vect[2] = (pSVar3->domain).bigend.vect[2];
  for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
    uVar18 = 1 << ((byte)lVar15 & 0x1f);
    uVar14 = (uint)lVar15;
    bx.bigend.vect[lVar15] =
         (bx.bigend.vect[lVar15] + (uint)((IVar13.itype >> (uVar14 & 0x1f) & 1) != 0)) -
         (uint)((bx.btype.itype >> (uVar14 & 0x1f) & 1) != 0);
    if ((IVar13.itype >> (uVar14 & 0x1f) & 1) == 0) {
      bx.btype.itype = ~uVar18 & bx.btype.itype;
    }
    else {
      bx.btype.itype = uVar18 | bx.btype.itype;
    }
  }
  pGVar4 = this->geom;
  uStackY_1d0 = 0x4887e0;
  cVar12 = (**(code **)(*(long *)((this->statedata->desc->bc_func).
                                  super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t + 0x38))();
  uStackY_1d0 = 0x4887f8;
  (**(code **)(*(long *)((this->statedata->desc->bc_func).
                         super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t + 0x30))();
  uStackY_1d0 = 0x488805;
  FArrayBox::FArrayBox(&tmp);
  uStackY_1d0 = 0x48881c;
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,'\0');
  dx = (pGVar4->super_CoordSys).dx;
  prob_domain = &pGVar4->prob_domain;
  while (mfi.currentIndex < mfi.endIndex) {
    iVar17 = mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[mfi.currentIndex];
    }
    src = &(mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
           super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
           super__Vector_impl_data._M_start[iVar17]->super_BaseFab<double>;
    bx_00 = &src->domain;
    bVar10 = false;
    bVar9 = false;
    for (lVar15 = 0x51; lVar15 != 0x54; lVar15 = lVar15 + 1) {
      bVar5 = true;
      if (aiStackY_2ac[lVar15] <= *(int *)((long)src + lVar15 * 4 + -300)) {
        bVar5 = aiStackY_2ac[lVar15 + 3] <
                *(int *)((long)(&src[-4].domain.smallend + -2) + lVar15 * 4);
      }
      bVar11 = (bool)(bVar10 | bVar5);
      if (*(char *)((long)(this->geom->super_CoordSys).offset + lVar15 + -8) == '\0') {
        bVar9 = (bool)(bVar5 | bVar9);
        bVar11 = bVar10;
      }
      bVar10 = bVar11;
    }
    if (bVar9) {
      if (cVar12 == '\0') {
        uStackY_1d0 = 0x48894e;
        StateData::FillBoundary
                  (this->statedata,(FArrayBox *)src,time,dx,prob_domain,dest_comp,this->src_comp,
                   num_comp);
      }
      else {
        uStackY_1d0 = 0x488925;
        StateData::FillBoundary
                  (this->statedata,bx_00,(FArrayBox *)src,time,this->geom,dest_comp,this->src_comp,
                   num_comp);
      }
      if (bVar10) {
        GrownDomain.bigend.vect[1] = bx.bigend.vect[1];
        GrownDomain.bigend.vect[2] = bx.bigend.vect[2];
        GrownDomain.btype.itype = bx.btype.itype;
        GrownDomain.smallend.vect[0] = bx.smallend.vect[0];
        GrownDomain.smallend.vect[1] = bx.smallend.vect[1];
        GrownDomain.smallend.vect[2] = bx.smallend.vect[2];
        GrownDomain.bigend.vect[0] = bx.bigend.vect[0];
        pGVar4 = this->geom;
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          if (*(char *)((long)(pGVar4->super_CoordSys).inv_dx + lVar15 + 0x19) == '\0') {
            iVar17 = bx.smallend.vect[lVar15];
            iVar2 = (src->domain).smallend.vect[lVar15];
            iVar16 = iVar17 - iVar2;
            if (iVar16 != 0 && iVar2 <= iVar17) {
              piVar1 = GrownDomain.smallend.vect + lVar15;
              *piVar1 = *piVar1 - iVar16;
            }
            iVar17 = (src->domain).bigend.vect[lVar15] - bx.bigend.vect[lVar15];
            if (0 < iVar17) {
              piVar1 = GrownDomain.bigend.vect + lVar15;
              *piVar1 = *piVar1 + iVar17;
            }
          }
        }
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          pGVar4 = this->geom;
          if (*(char *)((long)(pGVar4->super_CoordSys).inv_dx + lVar15 + 0x19) == '\x01') {
            uVar8 = *(undefined8 *)((src->domain).smallend.vect + 2);
            lo_slab.bigend.vect[1] = (int)((ulong)*(undefined8 *)(src->domain).bigend.vect >> 0x20);
            lo_slab._20_8_ = *(undefined8 *)((src->domain).bigend.vect + 2);
            lo_slab.smallend.vect._0_8_ = *(undefined8 *)(bx_00->smallend).vect;
            lo_slab.smallend.vect[2] = (int)uVar8;
            lo_slab.bigend.vect[0] = (int)((ulong)uVar8 >> 0x20);
            uVar8 = *(undefined8 *)((src->domain).smallend.vect + 2);
            hi_slab.bigend.vect[1] = (int)((ulong)*(undefined8 *)(src->domain).bigend.vect >> 0x20);
            hi_slab._20_8_ = *(undefined8 *)((src->domain).bigend.vect + 2);
            hi_slab.smallend.vect._0_8_ = *(undefined8 *)(bx_00->smallend).vect;
            hi_slab.smallend.vect[2] = (int)uVar8;
            hi_slab.bigend.vect[0] = (int)((ulong)uVar8 >> 0x20);
            iVar17 = ((pGVar4->domain).bigend.vect[lVar15] - (pGVar4->domain).smallend.vect[lVar15])
                     + 1;
            piVar1 = lo_slab.smallend.vect + lVar15;
            *piVar1 = *piVar1 + iVar17;
            piVar1 = lo_slab.bigend.vect + lVar15;
            *piVar1 = *piVar1 + iVar17;
            piVar1 = hi_slab.smallend.vect + lVar15;
            *piVar1 = *piVar1 - iVar17;
            piVar1 = hi_slab.bigend.vect + lVar15;
            *piVar1 = *piVar1 - iVar17;
            iVar17 = lo_slab.smallend.vect[0];
            if (lo_slab.smallend.vect[0] <= GrownDomain.smallend.vect[0]) {
              iVar17 = GrownDomain.smallend.vect[0];
            }
            if (lo_slab.smallend.vect[1] <= GrownDomain.smallend.vect[1]) {
              lo_slab.smallend.vect[1] = GrownDomain.smallend.vect[1];
            }
            lo_slab.smallend.vect[0] = iVar17;
            if (lo_slab.smallend.vect[2] <= GrownDomain.smallend.vect[2]) {
              lo_slab.smallend.vect[2] = GrownDomain.smallend.vect[2];
            }
            if (GrownDomain.bigend.vect[0] <= lo_slab.bigend.vect[0]) {
              lo_slab.bigend.vect[0] = GrownDomain.bigend.vect[0];
            }
            if (GrownDomain.bigend.vect[1] <= lo_slab.bigend.vect[1]) {
              lo_slab.bigend.vect[1] = GrownDomain.bigend.vect[1];
            }
            iVar2 = lo_slab.bigend.vect[2];
            if (GrownDomain.bigend.vect[2] <= lo_slab.bigend.vect[2]) {
              iVar2 = GrownDomain.bigend.vect[2];
            }
            iVar16 = GrownDomain.smallend.vect[0];
            if (GrownDomain.smallend.vect[0] < hi_slab.smallend.vect[0]) {
              iVar16 = hi_slab.smallend.vect[0];
            }
            iVar19 = GrownDomain.smallend.vect[1];
            if (GrownDomain.smallend.vect[1] < hi_slab.smallend.vect[1]) {
              iVar19 = hi_slab.smallend.vect[1];
            }
            hi_slab.smallend.vect[1] = iVar19;
            hi_slab.smallend.vect[0] = iVar16;
            iVar19 = GrownDomain.smallend.vect[2];
            if (GrownDomain.smallend.vect[2] < hi_slab.smallend.vect[2]) {
              iVar19 = hi_slab.smallend.vect[2];
            }
            iVar6 = GrownDomain.bigend.vect[0];
            if (hi_slab.bigend.vect[0] < GrownDomain.bigend.vect[0]) {
              iVar6 = hi_slab.bigend.vect[0];
            }
            iVar7 = GrownDomain.bigend.vect[1];
            if (hi_slab.bigend.vect[1] < GrownDomain.bigend.vect[1]) {
              iVar7 = hi_slab.bigend.vect[1];
            }
            lo_slab.bigend.vect[2] = iVar2;
            iVar20 = GrownDomain.bigend.vect[2];
            if (hi_slab.bigend.vect[2] < GrownDomain.bigend.vect[2]) {
              iVar20 = hi_slab.bigend.vect[2];
            }
            hi_slab.bigend.vect[2] = iVar20;
            hi_slab.smallend.vect[2] = iVar19;
            hi_slab.bigend.vect[0] = iVar6;
            hi_slab.bigend.vect[1] = iVar7;
            if (iVar17 <= lo_slab.bigend.vect[0]) {
              if (((lo_slab.smallend.vect[1] <= lo_slab.bigend.vect[1]) &&
                  (lo_slab.smallend.vect[2] <= iVar2)) && (lo_slab.btype.itype < 8)) {
                uStackY_1d0 = 0x488b53;
                FArrayBox::resize((FArrayBox *)&tmp.super_BaseFab<double>,&lo_slab,num_comp,
                                  (Arena *)0x0);
                iVar17 = ~(this->geom->domain).bigend.vect[lVar15] +
                         (this->geom->domain).smallend.vect[lVar15];
                db.bigend.vect[1] = lo_slab.bigend.vect[1];
                db.bigend.vect[2] = lo_slab.bigend.vect[2];
                db.btype.itype = lo_slab.btype.itype;
                db.smallend.vect[0] = lo_slab.smallend.vect[0];
                db.smallend.vect[1] = lo_slab.smallend.vect[1];
                db.smallend.vect[2] = lo_slab.smallend.vect[2];
                db.bigend.vect[0] = lo_slab.bigend.vect[0];
                piVar1 = db.smallend.vect + lVar15;
                *piVar1 = *piVar1 + iVar17;
                piVar1 = db.bigend.vect + lVar15;
                *piVar1 = *piVar1 + iVar17;
                uStackY_1d0 = 0x488bb0;
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (&tmp.super_BaseFab<double>,src,&db,dest_comp,&lo_slab,0,num_comp);
                if (cVar12 == '\0') {
                  uStackY_1d0 = 0x488c05;
                  StateData::FillBoundary
                            (this->statedata,(FArrayBox *)&tmp.super_BaseFab<double>,time,dx,
                             prob_domain,0,this->src_comp,num_comp);
                }
                else {
                  uStackY_1d0 = 0x488bda;
                  StateData::FillBoundary
                            (this->statedata,&lo_slab,(FArrayBox *)&tmp.super_BaseFab<double>,time,
                             this->geom,0,this->src_comp,num_comp);
                }
                uStackY_1d0 = 0x488c26;
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (src,&tmp.super_BaseFab<double>,&lo_slab,0,&db,dest_comp,num_comp);
                iVar16 = hi_slab.smallend.vect[0];
              }
            }
            if (((iVar16 <= hi_slab.bigend.vect[0]) &&
                (hi_slab.smallend.vect[1] <= hi_slab.bigend.vect[1])) &&
               ((hi_slab.smallend.vect[2] <= hi_slab.bigend.vect[2] && (hi_slab.btype.itype < 8))))
            {
              uStackY_1d0 = 0x488c6f;
              FArrayBox::resize((FArrayBox *)&tmp.super_BaseFab<double>,&hi_slab,num_comp,
                                (Arena *)0x0);
              iVar17 = ((this->geom->domain).bigend.vect[lVar15] -
                       (this->geom->domain).smallend.vect[lVar15]) + 1;
              db.bigend.vect[1] = hi_slab.bigend.vect[1];
              db.bigend.vect[2] = hi_slab.bigend.vect[2];
              db.btype.itype = hi_slab.btype.itype;
              db.smallend.vect[0] = hi_slab.smallend.vect[0];
              db.smallend.vect[1] = hi_slab.smallend.vect[1];
              db.smallend.vect[2] = hi_slab.smallend.vect[2];
              db.bigend.vect[0] = hi_slab.bigend.vect[0];
              piVar1 = db.smallend.vect + lVar15;
              *piVar1 = *piVar1 + iVar17;
              piVar1 = db.bigend.vect + lVar15;
              *piVar1 = *piVar1 + iVar17;
              uStackY_1d0 = 0x488cd1;
              BaseFab<double>::copy<(amrex::RunOn)1>
                        (&tmp.super_BaseFab<double>,src,&db,dest_comp,&hi_slab,0,num_comp);
              if (cVar12 == '\0') {
                uStackY_1d0 = 0x488d4d;
                StateData::FillBoundary
                          (this->statedata,(FArrayBox *)&tmp.super_BaseFab<double>,time,dx,
                           prob_domain,0,this->src_comp,num_comp);
              }
              else {
                uStackY_1d0 = 0x488cfb;
                StateData::FillBoundary
                          (this->statedata,&hi_slab,(FArrayBox *)&tmp.super_BaseFab<double>,time,
                           this->geom,0,this->src_comp,num_comp);
              }
              uStackY_1d0 = 0x488d6e;
              BaseFab<double>::copy<(amrex::RunOn)1>
                        (src,&tmp.super_BaseFab<double>,&hi_slab,0,&db,dest_comp,num_comp);
            }
          }
        }
      }
    }
    uStackY_1d0 = 0x488d83;
    MFIter::operator++(&mfi);
  }
  uStackY_1d0 = 0x488d95;
  MFIter::~MFIter(&mfi);
  uStackY_1d0 = 0x488da2;
  BaseFab<double>::~BaseFab(&tmp.super_BaseFab<double>);
  return;
}

Assistant:

void
StateDataPhysBCFunct::operator() (MultiFab& mf, int dest_comp, int num_comp, IntVect const& /* */,
                                  Real time, int /*bccomp*/)
{
    BL_PROFILE("StateDataPhysBCFunct::()");

    // Match domain box type to MF index type.
    const Box&     domain_mt   = amrex::convert(statedata->getDomain(),mf.ixType());
    const int*     domainlo    = domain_mt.loVect();
    const int*     domainhi    = domain_mt.hiVect();
    const Real*    dx          = geom.CellSize();
    const RealBox& prob_domain = geom.ProbDomain();

    bool has_bndryfunc_fab = statedata->desc->hasBndryFuncFab();
    bool run_on_gpu = statedata->desc->RunOnGPU() && Gpu::inLaunchRegion();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        FArrayBox tmp;

        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            FArrayBox& dest = mf[mfi];
            Array4<Real> const& desta = dest.array();
            const Box& bx = dest.box();

            bool has_phys_bc = false;
            bool is_periodic = false;
            for (int i = 0; i < AMREX_SPACEDIM; ++i) {
                bool touch = bx.smallEnd(i) < domainlo[i] || bx.bigEnd(i) > domainhi[i];
                if (geom.isPeriodic(i)) {
                    is_periodic = is_periodic || touch;
                } else {
                    has_phys_bc = has_phys_bc || touch;
                }
            }

            if (has_phys_bc)
            {
                if (has_bndryfunc_fab) {
                    statedata->FillBoundary(bx, dest, time, geom, dest_comp, src_comp, num_comp);
                } else {
                    statedata->FillBoundary(dest, time, dx, prob_domain, dest_comp, src_comp, num_comp);
                }

                if (is_periodic) // fix up corner
                {
                    Box GrownDomain = domain_mt;

                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                    {
                        if (!geom.isPeriodic(dir))
                        {
                            const int lo = domainlo[dir] - bx.smallEnd(dir);
                            const int hi = bx.bigEnd(dir) - domainhi[dir];
                            if (lo > 0) GrownDomain.growLo(dir,lo);
                            if (hi > 0) GrownDomain.growHi(dir,hi);
                        }
                    }

                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                    {
                        if (!geom.isPeriodic(dir)) continue;

                        Box lo_slab = bx;
                        Box hi_slab = bx;
                        lo_slab.shift(dir, geom.period(dir));
                        hi_slab.shift(dir,-geom.period(dir));
                        lo_slab &= GrownDomain;
                        hi_slab &= GrownDomain;

                        if (lo_slab.ok())
                        {
                            if (run_on_gpu)
                            {
                                tmp.resize(lo_slab,num_comp);
                                Elixir elitmp = tmp.elixir();
                                Array4<Real> const& tmpa = tmp.array();
                                const int ishift = -geom.period(dir);
                                amrex::launch(lo_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n)
                                                        = desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp);
                                                }
                                            }
                                        }
                                    }
                                });
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(lo_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                amrex::launch(lo_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp)
                                                        = tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n);
                                                }
                                            }
                                        }
                                    }
                                });
                            }
                            else
                            {
                                tmp.resize(lo_slab,num_comp);
                                const Box db = amrex::shift(lo_slab, dir, -geom.period(dir));
                                tmp.copy<RunOn::Host>(dest, db, dest_comp, lo_slab, 0, num_comp);
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(lo_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                dest.copy<RunOn::Host>(tmp, lo_slab, 0, db, dest_comp, num_comp);
                            }
                        }

                        if (hi_slab.ok())
                        {
                            if (run_on_gpu)
                            {
                                tmp.resize(hi_slab,num_comp);
                                Elixir elitmp = tmp.elixir();
                                Array4<Real> const& tmpa = tmp.array();
                                const int ishift = geom.period(dir);
                                amrex::launch(hi_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n)
                                                        = desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp);
                                                }
                                            }
                                        }
                                    }
                                });
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(hi_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                amrex::launch(hi_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp)
                                                        = tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n);
                                                }
                                            }
                                        }
                                    }
                                });
                            }
                            else
                            {
                                tmp.resize(hi_slab,num_comp);
                                const Box db = amrex::shift(hi_slab, dir, geom.period(dir));
                                tmp.copy<RunOn::Host>(dest, db, dest_comp, hi_slab, 0, num_comp);
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(hi_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                dest.copy<RunOn::Host>(tmp, hi_slab, 0, db, dest_comp, num_comp);
                            }
                        }
                    }
                }
            }
        }
    }
}